

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_OperatorEquals_Test<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_OperatorEquals_Test<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  *pdVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  bool bVar4;
  char *pcVar5;
  pointer *__ptr;
  char *in_R9;
  pair<unsigned_long,_unsigned_long> pVar6;
  TypeParam ht1;
  TypeParam ht2;
  undefined1 local_188 [8];
  undefined8 *local_180;
  key_equal local_178;
  AssertHelper local_168;
  undefined1 local_160 [40];
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  local_138;
  undefined1 local_a8 [8];
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  local_a0;
  
  local_160._0_8_ =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_160._8_8_ = local_160._8_8_ & 0xffffffff00000000;
  local_188 = (undefined1  [8])0x0;
  local_180 = (undefined8 *)((ulong)local_180 & 0xffffffff00000000);
  local_a8 = (undefined1  [8])((ulong)local_a8 & 0xffffffff00000000);
  local_a0.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher
  ._0_8_ = (int *)0x0;
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (&local_138,0,(hasher *)local_160,(key_equal *)local_188,(allocator_type *)local_a8);
  local_188 = (undefined1  [8])0x0;
  local_180 = (undefined8 *)((ulong)local_180 & 0xffffffff00000000);
  local_178._0_8_ = (long *)0x0;
  local_178.num_compares_ = 0;
  local_160._0_8_ = local_160._0_8_ & 0xffffffff00000000;
  local_160._8_8_ = (pointer)0x0;
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
              *)local_a8,0,(hasher *)local_188,&local_178,(allocator_type *)local_160);
  pcVar5 = UniqueObjectHelper<char_const*>(1);
  pdVar1 = &local_138.
            super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_;
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(pdVar1);
  local_138.
  super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.use_deleted_ =
       true;
  local_138.
  super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.key_info.delkey = pcVar5;
  pcVar5 = UniqueObjectHelper<char_const*>(2);
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&local_a0);
  local_a0.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.use_deleted_
       = true;
  local_a0.key_info.delkey = pcVar5;
  local_188 = (undefined1  [8])UniqueObjectHelper<char_const*>(10);
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_160,
           &local_138.
            super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)local_188);
  local_188 = (undefined1  [8])UniqueObjectHelper<char_const*>(0x14);
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_160,
           (BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
            *)local_a8,(value_type *)local_188);
  bVar4 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(pdVar1,&local_a0);
  local_180 = (undefined8 *)0x0;
  local_188[0] = (internal)!bVar4;
  if (bVar4) {
    testing::Message::Message((Message *)&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_160,(internal *)local_188,(AssertionResult *)"ht1 == ht2","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x197,(char *)local_160._0_8_);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if ((dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
         *)local_160._0_8_ !=
        (dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
         *)(local_160 + 0x10)) {
      operator_delete((void *)local_160._0_8_);
    }
    if ((long *)local_178._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_178._0_8_ + 8))();
    }
    puVar2 = local_180;
    if (local_180 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_180 != local_180 + 2) {
        operator_delete((undefined8 *)*local_180);
      }
      operator_delete(puVar2);
    }
  }
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::operator=(pdVar1,&local_a0);
  local_188[0] = (internal)
                 google::
                 dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
                 ::operator==(pdVar1,&local_a0);
  local_180 = (undefined8 *)0x0;
  if (!(bool)local_188[0]) {
    testing::Message::Message((Message *)&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_160,(internal *)local_188,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x199,(char *)local_160._0_8_);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if ((dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
         *)local_160._0_8_ !=
        (dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
         *)(local_160 + 0x10)) {
      operator_delete((void *)local_160._0_8_);
    }
    if ((long *)local_178._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_178._0_8_ + 8))();
    }
    puVar2 = local_180;
    if (local_180 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_180 != local_180 + 2) {
        operator_delete((undefined8 *)*local_180);
      }
      operator_delete(puVar2);
    }
  }
  local_a8 = (undefined1  [8])&PTR__BaseHashtableInterface_00c19828;
  if (local_a0.table != (pointer)0x0) {
    free(local_a0.table);
  }
  local_138.
  super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c19828;
  if (local_138.
      super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.table != (pointer)0x0) {
    free(local_138.
         super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.table);
  }
  local_160._0_8_ =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_160._8_8_ = local_160._8_8_ & 0xffffffff00000000;
  local_188 = (undefined1  [8])0x0;
  local_180 = (undefined8 *)((ulong)local_180 & 0xffffffff00000000);
  local_a8 = (undefined1  [8])((ulong)local_a8 & 0xffffffff00000000);
  local_a0.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher
  ._0_8_ = (int *)0x0;
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (&local_138,0,(hasher *)local_160,(key_equal *)local_188,(allocator_type *)local_a8);
  local_188 = (undefined1  [8])0x0;
  local_180 = (undefined8 *)((ulong)local_180 & 0xffffffff00000000);
  local_178.id_ = 0;
  local_178.num_hashes_ = 0;
  local_178.num_compares_ = 0;
  local_160._0_8_ = local_160._0_8_ & 0xffffffff00000000;
  local_160._8_8_ = (pointer)0x0;
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
              *)local_a8,0,(hasher *)local_188,&local_178,(allocator_type *)local_160);
  local_188 = (undefined1  [8])UniqueObjectHelper<char_const*>(0x1e);
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_160,
           &local_138.
            super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)local_188);
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::operator=(&local_138.
               super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_,&local_a0);
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  local_188 = (undefined1  [8])
              (local_138.
               super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.num_elements -
              local_138.
              super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_160,"0u","ht1.size()",(uint *)&local_178,(unsigned_long *)local_188);
  if (local_160[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_188);
    if ((pointer)local_160._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_160._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x19f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
    if (local_188 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_188 + 8))();
    }
  }
  uVar3 = local_160._8_8_;
  if ((pointer)local_160._8_8_ != (pointer)0x0) {
    if (*(pointer *)local_160._8_8_ != (pointer)(local_160._8_8_ + 0x10)) {
      operator_delete(*(pointer *)local_160._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_a8 = (undefined1  [8])&PTR__BaseHashtableInterface_00c19828;
  if (local_a0.table != (pointer)0x0) {
    free(local_a0.table);
  }
  local_138.
  super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c19828;
  if (local_138.
      super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.table != (pointer)0x0) {
    free(local_138.
         super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.table);
  }
  local_160._0_8_ =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_160._8_8_ = local_160._8_8_ & 0xffffffff00000000;
  local_188 = (undefined1  [8])0x0;
  local_180 = (undefined8 *)((ulong)local_180 & 0xffffffff00000000);
  local_a8 = (undefined1  [8])((ulong)local_a8 & 0xffffffff00000000);
  local_a0.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher
  ._0_8_ = (int *)0x0;
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (&local_138,0,(hasher *)local_160,(key_equal *)local_188,(allocator_type *)local_a8);
  local_188 = (undefined1  [8])0x0;
  local_180 = (undefined8 *)((ulong)local_180 & 0xffffffff00000000);
  local_178.id_ = 0;
  local_178.num_hashes_ = 0;
  local_178.num_compares_ = 0;
  local_160._0_8_ = local_160._0_8_ & 0xffffffff00000000;
  local_160._8_8_ = (pointer)0x0;
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
              *)local_a8,0,(hasher *)local_188,&local_178,(allocator_type *)local_160);
  pcVar5 = UniqueObjectHelper<char_const*>(1);
  pdVar1 = &local_138.
            super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_;
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(pdVar1);
  local_138.
  super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.use_deleted_ =
       true;
  local_138.
  super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.key_info.delkey = pcVar5;
  local_188 = (undefined1  [8])UniqueObjectHelper<char_const*>(1);
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_160,
           (BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
            *)local_a8,(value_type *)local_188);
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::operator=(pdVar1,&local_a0);
  local_178.id_ = 1;
  local_188 = (undefined1  [8])
              (local_138.
               super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.num_elements -
              local_138.
              super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_160,"1u","ht1.size()",(uint *)&local_178,(unsigned_long *)local_188);
  if (local_160[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_188);
    if ((pointer)local_160._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_160._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1a6,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
    if (local_188 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_188 + 8))();
    }
  }
  uVar3 = local_160._8_8_;
  if ((pointer)local_160._8_8_ != (pointer)0x0) {
    if (*(pointer *)local_160._8_8_ != (pointer)(local_160._8_8_ + 0x10)) {
      operator_delete(*(pointer *)local_160._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_168.data_._0_4_ = 1;
  local_178._0_8_ = UniqueObjectHelper<char_const*>(1);
  pVar6 = google::
          dense_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<ValueType,unsigned_long,18446744073709551615ul>>
          ::find_position<char_const*>
                    ((dense_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<ValueType,unsigned_long,18446744073709551615ul>>
                      *)pdVar1,(char **)&local_178);
  local_188._1_7_ = 0;
  local_188[0] = (internal)(pVar6.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_160,"1u","ht1.count(this->UniqueKey(1))",(uint *)&local_168,
             (unsigned_long *)local_188);
  if (local_160[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_188);
    if ((pointer)local_160._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_160._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1a7,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
    if (local_188 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_188 + 8))();
    }
  }
  uVar3 = local_160._8_8_;
  if ((pointer)local_160._8_8_ != (pointer)0x0) {
    if (*(pointer *)local_160._8_8_ != (pointer)(local_160._8_8_ + 0x10)) {
      operator_delete(*(pointer *)local_160._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_a8 = (undefined1  [8])&PTR__BaseHashtableInterface_00c19828;
  if (local_a0.table != (pointer)0x0) {
    free(local_a0.table);
  }
  local_138.
  super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c19828;
  if (local_138.
      super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.table != (pointer)0x0) {
    free(local_138.
         super_BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.table);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, OperatorEquals) {
  {
    TypeParam ht1, ht2;
    ht1.set_deleted_key(this->UniqueKey(1));
    ht2.set_deleted_key(this->UniqueKey(2));

    ht1.insert(this->UniqueObject(10));
    ht2.insert(this->UniqueObject(20));
    EXPECT_FALSE(ht1 == ht2);
    ht1 = ht2;
    EXPECT_TRUE(ht1 == ht2);
  }
  {
    TypeParam ht1, ht2;
    ht1.insert(this->UniqueObject(30));
    ht1 = ht2;
    EXPECT_EQ(0u, ht1.size());
  }
  {
    TypeParam ht1, ht2;
    ht1.set_deleted_key(this->UniqueKey(1));
    ht2.insert(this->UniqueObject(1));  // has same key as ht1.delkey
    ht1 = ht2;                          // should reset deleted-key to 'unset'
    EXPECT_EQ(1u, ht1.size());
    EXPECT_EQ(1u, ht1.count(this->UniqueKey(1)));
  }
}